

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

Image * __thiscall
pbrt::Image::FloatResizeUp
          (Image *__return_storage_ptr__,Image *this,Point2i newRes,WrapMode2D wrapMode)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_t sVar2;
  Allocator alloc;
  long *plVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  char *args;
  char *args_1;
  uint newRes_00;
  uint newRes_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  int va;
  undefined4 uStack_b4;
  pointer pRStack_b0;
  pointer local_a8;
  int vb;
  undefined4 uStack_94;
  pointer pRStack_90;
  pointer local_88;
  vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_> local_78;
  WrapMode2D wrapMode_local;
  undefined1 local_58 [24];
  code *pcStack_40;
  ColorEncodingHandle local_38;
  
  newRes_01 = newRes.super_Tuple2<pbrt::Point2,_int>.x;
  _va = (pointer)CONCAT44(uStack_b4,newRes_01);
  iVar5 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  _vb = (pointer)CONCAT44(uStack_94,iVar5);
  wrapMode_local = wrapMode;
  if ((int)newRes_01 < iVar5) {
    args_1 = "resolution.x";
    args = "newRes.x";
    iVar5 = 0x10b;
  }
  else {
    newRes_00 = newRes.super_Tuple2<pbrt::Point2,_int>.y;
    _va = (pointer)CONCAT44(uStack_b4,newRes_00);
    iVar5 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
    _vb = (pointer)CONCAT44(uStack_94,iVar5);
    if (iVar5 <= (int)newRes_00) {
      pbVar1 = (this->channelNames).ptr;
      sVar2 = (this->channelNames).nStored;
      local_38.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )0;
      alloc.memoryResource = pstd::pmr::new_delete_resource();
      channels.n = sVar2;
      channels.ptr = pbVar1;
      Image(__return_storage_ptr__,Float,newRes,channels,&local_38,alloc);
      local_a8 = (pointer)0x0;
      _va = (pointer)0x0;
      pRStack_b0 = (pointer)0x0;
      ResampleWeights(&local_78,(this->resolution).super_Tuple2<pbrt::Point2,_int>.x,newRes_01);
      _va = local_78.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>
            ._M_impl.super__Vector_impl_data._M_start;
      pRStack_b0 = local_78.
                   super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      local_a8 = local_78.
                 super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      ResampleWeights(&local_78,(this->resolution).super_Tuple2<pbrt::Point2,_int>.y,newRes_00);
      _vb = local_78.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>
            ._M_impl.super__Vector_impl_data._M_start;
      pRStack_90 = local_78.
                   super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      local_88 = local_78.
                 super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      _local_58 = ZEXT832(0) << 0x20;
      local_78.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44((int)newRes_00 >> 0x1f & newRes_00,(int)newRes_01 >> 0x1f & newRes_01);
      uVar4 = 0;
      uVar6 = 0;
      if (0 < (int)newRes_01) {
        uVar6 = (ulong)newRes.super_Tuple2<pbrt::Point2,_int> & 0xffffffff;
      }
      if (newRes_00 != 0 && -1 < (long)newRes.super_Tuple2<pbrt::Point2,_int>) {
        uVar4 = (ulong)newRes_00;
      }
      local_78.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)(uVar6 | uVar4 << 0x20);
      plVar3 = (long *)operator_new(0x28);
      *plVar3 = (long)&va;
      plVar3[1] = (long)&vb;
      plVar3[2] = (long)this;
      plVar3[3] = (long)&wrapMode_local;
      local_58._0_8_ = plVar3;
      plVar3[4] = (long)__return_storage_ptr__;
      local_58._16_8_ =
           std::
           _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp:276:45)>
           ::_M_manager;
      pcStack_40 = std::
                   _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp:276:45)>
                   ::_M_invoke;
      ParallelFor2D((pbrt *)&local_78,(Bounds2i *)local_58,
                    (function<void_(pbrt::Bounds2<int>)> *)
                    std::
                    _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp:276:45)>
                    ::_M_invoke);
      if ((code *)local_58._16_8_ != (code *)0x0) {
        (*(code *)local_58._16_8_)(local_58,local_58,3);
      }
      if (_vb != (pointer)0x0) {
        operator_delete(_vb,(long)local_88 - (long)_vb);
      }
      if (_va != (pointer)0x0) {
        operator_delete(_va,(long)local_a8 - (long)_va);
      }
      return __return_storage_ptr__;
    }
    args_1 = "resolution.y";
    args = "newRes.y";
    iVar5 = 0x10c;
  }
  LogFatal<char_const(&)[9],char_const(&)[13],char_const(&)[9],int&,char_const(&)[13],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
             ,iVar5,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [9])args,
             (char (*) [13])args_1,(char (*) [9])args,&va,(char (*) [13])args_1,&vb);
}

Assistant:

Image Image::FloatResizeUp(Point2i newRes, WrapMode2D wrapMode) const {
    CHECK_GE(newRes.x, resolution.x);
    CHECK_GE(newRes.y, resolution.y);
    Image resampledImage(PixelFormat::Float, newRes, channelNames);
    // Compute $x$ and $y$ resampling weights for image resizing
    std::vector<ResampleWeight> xWeights, yWeights;
    xWeights = ResampleWeights(resolution[0], newRes[0]);
    yWeights = ResampleWeights(resolution[1], newRes[1]);

    // Resize image in parallel, working by tiles
    ParallelFor2D(Bounds2i({0, 0}, newRes), [&](Bounds2i outExtent) {
        // Determine extent in source image and copy pixel values to _inBuf_
        Bounds2i inExtent(Point2i(xWeights[outExtent.pMin.x].firstPixel,
                                  yWeights[outExtent.pMin.y].firstPixel),
                          Point2i(xWeights[outExtent.pMax.x - 1].firstPixel + 4,
                                  yWeights[outExtent.pMax.y - 1].firstPixel + 4));
        std::vector<float> inBuf(NChannels() * inExtent.Area());
        CopyRectOut(inExtent, pstd::span<float>(inBuf), wrapMode);

        // Resize image in the $x$ dimension
        // Compute image extents and allocate _xBuf_
        int nxOut = outExtent.pMax.x - outExtent.pMin.x;
        int nyOut = outExtent.pMax.y - outExtent.pMin.y;
        int nxIn = inExtent.pMax.x - inExtent.pMin.x;
        int nyIn = inExtent.pMax.y - inExtent.pMin.y;
        std::vector<float> xBuf(NChannels() * nyIn * nxOut);

        int xBufOffset = 0;
        for (int yOut = inExtent.pMin.y; yOut < inExtent.pMax.y; ++yOut) {
            for (int xOut = outExtent.pMin.x; xOut < outExtent.pMax.x; ++xOut) {
                // Resample image pixel _(xOut, yOut)_
                DCHECK(xOut >= 0 && xOut < xWeights.size());
                const ResampleWeight &rsw = xWeights[xOut];
                // Compute _inOffset_ into _inBuf_ for _(xOut, yOut)_
                // w.r.t. inBuf
                int xIn = rsw.firstPixel - inExtent.pMin.x;
                DCHECK_GE(xIn, 0);
                DCHECK_LT(xIn + 3, nxIn);
                int yIn = yOut - inExtent.pMin.y;
                int inOffset = NChannels() * (xIn + yIn * nxIn);
                DCHECK_GE(inOffset, 0);
                DCHECK_LT(inOffset + 3 * NChannels(), inBuf.size());

                for (int c = 0; c < NChannels(); ++c, ++xBufOffset, ++inOffset)
                    xBuf[xBufOffset] = rsw.weight[0] * inBuf[inOffset] +
                                       rsw.weight[1] * inBuf[inOffset + NChannels()] +
                                       rsw.weight[2] * inBuf[inOffset + 2 * NChannels()] +
                                       rsw.weight[3] * inBuf[inOffset + 3 * NChannels()];
            }
        }

        // Resize image in the $y$ dimension
        std::vector<float> outBuf(NChannels() * nxOut * nyOut);
        for (int x = 0; x < nxOut; ++x) {
            for (int y = 0; y < nyOut; ++y) {
                int yOut = y + outExtent[0][1];
                DCHECK(yOut >= 0 && yOut < yWeights.size());
                const ResampleWeight &rsw = yWeights[yOut];

                DCHECK_GE(rsw.firstPixel - inExtent[0][1], 0);
                int xBufOffset =
                    NChannels() * (x + nxOut * (rsw.firstPixel - inExtent[0][1]));
                DCHECK_GE(xBufOffset, 0);
                int step = NChannels() * nxOut;
                DCHECK_LT(xBufOffset + 3 * step, xBuf.size());

                int outOffset = NChannels() * (x + y * nxOut);
                for (int c = 0; c < NChannels(); ++c, ++outOffset, ++xBufOffset)
                    outBuf[outOffset] =
                        std::max<Float>(0, (rsw.weight[0] * xBuf[xBufOffset] +
                                            rsw.weight[1] * xBuf[xBufOffset + step] +
                                            rsw.weight[2] * xBuf[xBufOffset + 2 * step] +
                                            rsw.weight[3] * xBuf[xBufOffset + 3 * step]));
            }
        }

        // Copy resampled image pixels out into _resampledImage_
        resampledImage.CopyRectIn(outExtent, outBuf);
    });

    return resampledImage;
}